

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t *
Wlc_NtkDeriveFirstTotal
          (Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Int_t *vMemFanins,int iFirstMemPi,int iFirstMemCi,
          int fVerbose)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Wlc_Obj_t *pWVar4;
  Wlc_Obj_t *pWVar5;
  char *pcVar6;
  int iVar7;
  uint i;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  
  p_00 = Vec_IntStart(vMemObjs->nSize * 3);
  iVar11 = 0;
  iVar8 = 0;
  iVar9 = 0;
  do {
    if (vMemObjs->nSize <= iVar8) {
      if (iVar9 != vMemFanins->nSize) {
        __assert_fail("nMemFanins == Vec_IntSize(vMemFanins)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x2bf,
                      "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      if (fVerbose != 0) {
        uVar10 = p_00->nSize;
        if ((int)uVar10 < 1) {
          uVar10 = 0;
        }
        for (i = 0; uVar10 != i; i = i + 1) {
          uVar3 = Vec_IntEntry(p_00,i);
          printf("Obj %5d  Fanin %5d : ",(ulong)i / 3,(ulong)(i % 3));
          iVar8 = Vec_IntEntry(vMemObjs,(int)((ulong)i / 3));
          pcVar6 = Wlc_ObjName(p,iVar8);
          printf("%16s : %d(%d)\n",pcVar6,(ulong)(uint)((int)uVar3 >> 10),(ulong)(uVar3 & 0x3ff));
        }
      }
      return p_00;
    }
    iVar1 = Vec_IntEntry(vMemObjs,iVar8);
    pWVar4 = Wlc_NtkObj(p,iVar1);
    if ((*(ushort *)pWVar4 & 0x3f) - 0x36 < 2) {
      for (iVar1 = 0; iVar1 < (int)pWVar4->nFanins; iVar1 = iVar1 + 1) {
        if (iVar1 != 0) {
          iVar2 = Wlc_ObjFaninId(pWVar4,iVar1);
          pWVar5 = Wlc_NtkObj(p,iVar2);
          iVar7 = pWVar5->End - pWVar5->Beg;
          iVar2 = -iVar7;
          if (0 < iVar7) {
            iVar2 = iVar7;
          }
          Vec_IntWriteEntry(p_00,iVar11 + iVar1,iVar2 + 1U | iFirstMemCi << 10);
          iVar7 = pWVar5->End - pWVar5->Beg;
          iVar2 = -iVar7;
          if (0 < iVar7) {
            iVar2 = iVar7;
          }
          iFirstMemCi = iFirstMemCi + iVar2 + 1;
          iVar9 = iVar9 + 1;
        }
      }
      if ((undefined1  [24])((undefined1  [24])*pWVar4 & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x36) {
        iVar2 = pWVar4->End - pWVar4->Beg;
        iVar1 = -iVar2;
        if (0 < iVar2) {
          iVar1 = iVar2;
        }
        Vec_IntWriteEntry(p_00,iVar8 * 3 + 2,iVar1 + 1U | iFirstMemPi << 10);
        iVar2 = pWVar4->End - pWVar4->Beg;
        iVar1 = -iVar2;
        if (0 < iVar2) {
          iVar1 = iVar2;
        }
        iFirstMemPi = iFirstMemPi + iVar1 + 1;
      }
    }
    else if ((*(ushort *)pWVar4 & 0x3f) == 8) {
      pWVar4 = Wlc_ObjFanin0(p,pWVar4);
      if (pWVar4->End != pWVar4->Beg) {
        __assert_fail("Wlc_ObjRange(pFanin) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                      ,0x2a8,
                      "Vec_Int_t *Wlc_NtkDeriveFirstTotal(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                     );
      }
      Vec_IntWriteEntry(p_00,iVar8 * 3,iFirstMemCi * 0x400 + 1);
      iVar2 = pWVar4->End - pWVar4->Beg;
      iVar1 = -iVar2;
      if (0 < iVar2) {
        iVar1 = iVar2;
      }
      iFirstMemCi = iFirstMemCi + iVar1 + 1;
      iVar9 = iVar9 + 1;
    }
    iVar8 = iVar8 + 1;
    iVar11 = iVar11 + 3;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkDeriveFirstTotal( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Int_t * vMemFanins, int iFirstMemPi, int iFirstMemCi, int fVerbose )
{
    Vec_Int_t * vFirstTotal = Vec_IntStart( 3 * Vec_IntSize(vMemObjs) ); // contains pairs of (first CO bit: range) for each input/output of a node
    Wlc_Obj_t * pObj, * pFanin; int i, k, iFanin, nMemFanins = 0;
    Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
    {
        if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
        {
            //Vec_IntPush( vMemFanins, Wlc_ObjFaninId0(pObj) );
            pFanin = Wlc_ObjFanin0(p, pObj);
            assert( Wlc_ObjRange(pFanin) == 1 );
            Vec_IntWriteEntry( vFirstTotal, 3*i, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
            iFirstMemCi += Wlc_ObjRange(pFanin);
            nMemFanins++;
        }
        else if ( Wlc_ObjType(pObj) == WLC_OBJ_READ || Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
        {
            Wlc_ObjForEachFanin( pObj, iFanin, k )
                if ( k > 0 )
                {
                    //Vec_IntPush( vMemFanins, iFanin );
                    pFanin = Wlc_NtkObj(p, iFanin);
                    Vec_IntWriteEntry( vFirstTotal, 3*i + k, (iFirstMemCi << 10) | Wlc_ObjRange(pFanin) );
                    iFirstMemCi += Wlc_ObjRange(pFanin);
                    nMemFanins++;
                }
            if ( Wlc_ObjType(pObj) == WLC_OBJ_READ )
            {
                Vec_IntWriteEntry( vFirstTotal, 3*i + 2, (iFirstMemPi << 10) | Wlc_ObjRange(pObj) );
                iFirstMemPi += Wlc_ObjRange(pObj);
            }
        }
    }
    assert( nMemFanins == Vec_IntSize(vMemFanins) );
    if ( fVerbose )
    Vec_IntForEachEntry( vFirstTotal, iFanin, i )
    {
        printf( "Obj %5d  Fanin %5d : ", i/3, i%3 );
        printf( "%16s : %d(%d)\n", Wlc_ObjName(p, Vec_IntEntry(vMemObjs, i/3)), iFanin >> 10, iFanin & 0x3FF );
    }
    return vFirstTotal;
}